

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O2

HalfedgeHandle __thiscall
OpenMesh::PolyConnectivity::find_halfedge
          (PolyConnectivity *this,VertexHandle _start_vh,VertexHandle _end_vh)

{
  value_type _heh;
  BaseHandle BVar1;
  undefined1 local_38 [8];
  ConstVertexOHalfedgeIter voh_it;
  
  if ((_start_vh.super_BaseHandle.idx_ != -1) && (_end_vh.super_BaseHandle.idx_ != -1)) {
    cvoh_iter((ConstVertexOHalfedgeIter *)local_38,this,_start_vh);
    while( true ) {
      if (voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ == -1) {
        return (HalfedgeHandle)(BaseHandle)InvalidHalfedgeHandle.idx_;
      }
      if (((int)voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ ==
           voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) break;
      _heh = Iterators::
             GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
             ::operator*((ConstVertexOHalfedgeIter *)local_38);
      BVar1.idx_ = (int)ArrayKernel::to_vertex_handle
                                  (&this->super_ArrayKernel,_heh.super_BaseHandle.idx_);
      if ((BaseHandle)BVar1.idx_ == _end_vh.super_BaseHandle.idx_) {
        BVar1.idx_ = (int)Iterators::
                          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                          ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                                       *)local_38);
        return (BaseHandle)(BaseHandle)BVar1.idx_;
      }
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((ConstVertexOHalfedgeIter *)local_38);
    }
    return (HalfedgeHandle)(BaseHandle)InvalidHalfedgeHandle.idx_;
  }
  __assert_fail("_start_vh.is_valid() && _end_vh.is_valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x3a,
                "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::find_halfedge(VertexHandle, VertexHandle) const"
               );
}

Assistant:

PolyConnectivity::HalfedgeHandle
PolyConnectivity::find_halfedge(VertexHandle _start_vh, VertexHandle _end_vh ) const
{
  assert(_start_vh.is_valid() && _end_vh.is_valid());

  for (ConstVertexOHalfedgeIter voh_it = cvoh_iter(_start_vh); voh_it.is_valid(); ++voh_it)
    if (to_vertex_handle(*voh_it) == _end_vh)
      return *voh_it;

  return InvalidHalfedgeHandle;
}